

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall
ConnmanTestMsg::ReceiveMsgFrom(ConnmanTestMsg *this,CNode *node,CSerializedNetMsg *ser_msg)

{
  _Head_base<0UL,_Transport_*,_false> _Var1;
  int iVar2;
  undefined1 uVar3;
  ConnmanTestMsg *this_00;
  long in_FS_OFFSET;
  Span<const_unsigned_char> msg_bytes;
  bool complete;
  undefined1 local_50 [40];
  atomic<unsigned_long> local_28;
  
  local_28.super___atomic_base<unsigned_long>._M_i =
       *(__atomic_base<unsigned_long> *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  iVar2 = (*(_Var1._M_head_impl)->_vptr_Transport[6])(_Var1._M_head_impl,ser_msg);
  if ((char)iVar2 == '\0') {
    __assert_fail("queued",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/net.cpp"
                  ,0x5e,"bool ConnmanTestMsg::ReceiveMsgFrom(CNode &, CSerializedNetMsg &&) const");
  }
  local_50[0x27] = 0;
  _Var1._M_head_impl =
       (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  this_00 = (ConnmanTestMsg *)local_50;
  (*(_Var1._M_head_impl)->_vptr_Transport[7])(this_00,_Var1._M_head_impl,0);
  uVar3 = 0;
  if ((__pthread_internal_list *)local_50._24_8_ != (__pthread_internal_list *)0x0) {
    do {
      msg_bytes.m_size = local_50._24_8_;
      msg_bytes.m_data = (uchar *)local_50._16_8_;
      NodeReceiveMsgBytes(this_00,node,msg_bytes,(bool *)(local_50 + 0x27));
      _Var1._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Transport[8])(_Var1._M_head_impl,local_50._24_8_);
      _Var1._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      this_00 = (ConnmanTestMsg *)local_50;
      (*(_Var1._M_head_impl)->_vptr_Transport[7])((ConnmanTestMsg *)local_50,_Var1._M_head_impl,0);
      uVar3 = local_50[0x27];
    } while ((__pthread_internal_list *)local_50._24_8_ != (__pthread_internal_list *)0x0);
  }
  if ((__atomic_base<unsigned_long>)*(__int_type_conflict *)(in_FS_OFFSET + 0x28) !=
      local_28.super___atomic_base<unsigned_long>._M_i) {
    __stack_chk_fail();
  }
  return (bool)(uVar3 & 1);
}

Assistant:

bool ConnmanTestMsg::ReceiveMsgFrom(CNode& node, CSerializedNetMsg&& ser_msg) const
{
    bool queued = node.m_transport->SetMessageToSend(ser_msg);
    assert(queued);
    bool complete{false};
    while (true) {
        const auto& [to_send, _more, _msg_type] = node.m_transport->GetBytesToSend(false);
        if (to_send.empty()) break;
        NodeReceiveMsgBytes(node, to_send, complete);
        node.m_transport->MarkBytesSent(to_send.size());
    }
    return complete;
}